

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

uint8_t __thiscall
unodb::detail::
basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::get_sorted_key_array_insert_position
          (basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
           *this,byte key_byte)

{
  undefined1 auVar1 [16];
  byte bVar2;
  bool bVar3;
  byte bVar4;
  uint x;
  const_iterator pvVar5;
  const_iterator pvVar6;
  in_critical_section<std::byte> *piVar7;
  in_critical_section *this_00;
  in_critical_section<std::byte> *__last;
  key_union *this_01;
  __m128i x_00;
  __m128i y;
  byte local_da;
  uint8_t result;
  uint bit_field;
  uint mask;
  __m128i lesser_key_positions;
  __m128i replicated_insert_key;
  uchar children_count_;
  byte key_byte_local;
  basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *this_local;
  undefined8 local_28;
  ulong uStack_20;
  
  bVar2 = in_critical_section<unsigned_char>::load
                    (&(this->
                      super_basic_inode_16_parent<unodb::detail::basic_art_policy<std::span<const_std::byte>,_std::span<const_std::byte>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                      ).
                      super_basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                      .children_count);
  if (0xf < bVar2) {
    __assert_fail("children_count_ < basic_inode_16::capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x7ec,
                  "auto unodb::detail::basic_inode_16<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::get_sorted_key_array_insert_position(std::byte) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                 );
  }
  pvVar5 = std::array<unodb::in_critical_section<std::byte>,_16UL>::cbegin(&(this->keys).byte_array)
  ;
  pvVar6 = std::array<unodb::in_critical_section<std::byte>,_16UL>::cbegin(&(this->keys).byte_array)
  ;
  bVar3 = std::is_sorted<unodb::in_critical_section<std::byte>const*>(pvVar5,pvVar6 + bVar2);
  if (!bVar3) {
    __assert_fail("std::is_sorted( keys.byte_array.cbegin(), keys.byte_array.cbegin() + children_count_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x7ee,
                  "auto unodb::detail::basic_inode_16<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::get_sorted_key_array_insert_position(std::byte) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                 );
  }
  pvVar5 = std::array<unodb::in_critical_section<std::byte>,_16UL>::cbegin(&(this->keys).byte_array)
  ;
  pvVar6 = std::array<unodb::in_critical_section<std::byte>,_16UL>::cbegin(&(this->keys).byte_array)
  ;
  __last = pvVar6 + bVar2;
  piVar7 = std::adjacent_find<unodb::in_critical_section<std::byte>const*>(pvVar5,__last);
  this_01 = &this->keys;
  pvVar5 = std::array<unodb::in_critical_section<std::byte>,_16UL>::cbegin(&this_01->byte_array);
  y[0] = (long)(int)(uint)bVar2;
  y[1] = pvVar5 + y[0];
  if (piVar7 < y[1]) {
    __assert_fail("std::adjacent_find(keys.byte_array.cbegin(), keys.byte_array.cbegin() + children_count_) >= keys.byte_array.cbegin() + children_count_"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x7f2,
                  "auto unodb::detail::basic_inode_16<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::get_sorted_key_array_insert_position(std::byte) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                 );
  }
  auVar1 = vpinsrb_avx(ZEXT116(key_byte),(uint)key_byte,1);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,2);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,3);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,4);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,5);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,6);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,7);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,8);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,9);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,10);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,0xb);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,0xc);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,0xd);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,0xe);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,0xf);
  local_28 = auVar1._0_8_;
  uStack_20 = auVar1._8_8_;
  x_00[1] = (longlong)__last;
  x_00[0] = (longlong)this_01;
  _mm_cmple_epu8(x_00,y);
  auVar1._8_8_ = uStack_20;
  auVar1._0_8_ = local_28;
  x = (uint)(ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                     (ushort)((byte)(uStack_20 >> 7) & 1) << 8 |
                     (ushort)((byte)(uStack_20 >> 0xf) & 1) << 9 |
                     (ushort)((byte)(uStack_20 >> 0x17) & 1) << 10 |
                     (ushort)((byte)(uStack_20 >> 0x1f) & 1) << 0xb |
                     (ushort)((byte)(uStack_20 >> 0x27) & 1) << 0xc |
                     (ushort)((byte)(uStack_20 >> 0x2f) & 1) << 0xd |
                     (ushort)((byte)(uStack_20 >> 0x37) & 1) << 0xe |
                    (ushort)(byte)(uStack_20 >> 0x3f) << 0xf) & (1 << (bVar2 & 0x1f)) - 1U;
  local_da = bVar2;
  if (x != 0) {
    local_da = ctz<unsigned_int>(x);
  }
  bVar3 = true;
  if ((local_da != bVar2) && (bVar3 = false, local_da < bVar2)) {
    this_00 = (in_critical_section *)
              std::array<unodb::in_critical_section<std::byte>,_16UL>::operator[]
                        (&(this->keys).byte_array,(ulong)local_da);
    bVar4 = in_critical_section::operator_cast_to_byte(this_00);
    bVar3 = bVar4 != key_byte;
  }
  if (bVar3) {
    return local_da;
  }
  __assert_fail("result == children_count_ || (result < children_count_ && keys.byte_array[result] != key_byte)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                ,0x809,
                "auto unodb::detail::basic_inode_16<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::get_sorted_key_array_insert_position(std::byte) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
               );
}

Assistant:

[[nodiscard, gnu::pure]] constexpr auto get_sorted_key_array_insert_position(
      std::byte key_byte) noexcept {
    const auto children_count_ = this->children_count.load();

    UNODB_DETAIL_ASSERT(children_count_ < basic_inode_16::capacity);
    UNODB_DETAIL_ASSERT(std::is_sorted(
        keys.byte_array.cbegin(), keys.byte_array.cbegin() + children_count_));
    UNODB_DETAIL_ASSERT(
        std::adjacent_find(keys.byte_array.cbegin(),
                           keys.byte_array.cbegin() + children_count_) >=
        keys.byte_array.cbegin() + children_count_);

#ifdef UNODB_DETAIL_X86_64
    const auto replicated_insert_key =
        _mm_set1_epi8(static_cast<char>(key_byte));
    const auto lesser_key_positions =
        _mm_cmple_epu8(replicated_insert_key, keys.byte_vector);
    const auto mask = (1U << children_count_) - 1;
    const auto bit_field =
        static_cast<unsigned>(_mm_movemask_epi8(lesser_key_positions)) & mask;
    const auto result = (bit_field != 0)
                            ? detail::ctz(bit_field)
                            : static_cast<std::uint8_t>(children_count_);
#else
    // This is also the best current ARM implementation
    const auto result = static_cast<std::uint8_t>(
        std::lower_bound(keys.byte_array.cbegin(),
                         keys.byte_array.cbegin() + children_count_, key_byte) -
        keys.byte_array.cbegin());
#endif

    UNODB_DETAIL_ASSERT(
        result == children_count_ ||
        (result < children_count_ && keys.byte_array[result] != key_byte));
    return result;
  }